

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat.cpp
# Opt level: O0

void __thiscall ncnn::Mat::create_like(Mat *this,Mat *m,Allocator *_allocator)

{
  undefined8 in_RDX;
  Mat *in_RSI;
  size_t in_RDI;
  int unaff_retaddr;
  undefined4 unaff_retaddr_00;
  Allocator *in_stack_00000008;
  int _dims;
  Allocator *in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffe0;
  int iVar1;
  
  iVar1 = in_RSI->dims;
  if (iVar1 == 1) {
    create(in_RSI,(int)((ulong)in_RDX >> 0x20),CONCAT44(1,in_stack_ffffffffffffffe0),
           (int)(in_RDI >> 0x20),in_stack_ffffffffffffffd0);
  }
  if (iVar1 == 2) {
    create(in_RSI,(int)((ulong)in_RDX >> 0x20),(int)in_RDX,CONCAT44(2,in_stack_ffffffffffffffe0),
           (int)(in_RDI >> 0x20),in_stack_ffffffffffffffd0);
  }
  if (iVar1 == 3) {
    create(in_RSI,(int)((ulong)in_RDX >> 0x20),(int)in_RDX,3,in_RDI,
           (int)((ulong)in_stack_ffffffffffffffd0 >> 0x20),
           (Allocator *)CONCAT44(unaff_retaddr_00,unaff_retaddr));
  }
  if (iVar1 == 4) {
    create(in_RSI,(int)((ulong)in_RDX >> 0x20),(int)in_RDX,4,in_stack_ffffffffffffffe0,in_RDI,
           unaff_retaddr,in_stack_00000008);
  }
  return;
}

Assistant:

void Mat::create_like(const Mat& m, Allocator* _allocator)
{
    int _dims = m.dims;
    if (_dims == 1)
        create(m.w, m.elemsize, m.elempack, _allocator);
    if (_dims == 2)
        create(m.w, m.h, m.elemsize, m.elempack, _allocator);
    if (_dims == 3)
        create(m.w, m.h, m.c, m.elemsize, m.elempack, _allocator);
    if (_dims == 4)
        create(m.w, m.h, m.d, m.c, m.elemsize, m.elempack, _allocator);
}